

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O0

void authentication_do_work(AUTHENTICATION_HANDLE authentication_handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_CREDENTIAL_TYPE local_28;
  _Bool is_timed_out_1;
  IOTHUB_CREDENTIAL_TYPE cred_type;
  _Bool is_timed_out;
  AUTHENTICATION_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  AUTHENTICATION_HANDLE authentication_handle_local;
  
  l = (LOGGER_LOG)authentication_handle;
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    instance = (AUTHENTICATION_INSTANCE_conflict *)xlogging_get_log_function();
    if (instance != (AUTHENTICATION_INSTANCE_conflict *)0x0) {
      (*(code *)instance)(0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                          ,"authentication_do_work",0x21a,1,
                          "authentication_do_work failed (authentication_handle is NULL)");
    }
  }
  else {
    _cred_type = authentication_handle;
    if ((authentication_handle->is_cbs_put_token_in_progress & 1U) == 0) {
      if (authentication_handle->state == AUTHENTICATION_STATE_STARTED) {
        local_28 = IoTHubClient_Auth_Get_Credential_Type
                             (authentication_handle->authorization_module);
        if ((((local_28 == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) ||
             (local_28 == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)) &&
            (iVar1 = verify_sas_token_refresh_timeout(_cred_type,(_Bool *)((long)&l_1 + 7)),
            iVar1 == 0)) && ((l_1._7_1_ & 1) != 0)) {
          _cred_type->is_sas_token_refresh_in_progress = true;
          iVar1 = create_and_put_SAS_token_to_cbs(_cred_type);
          if ((iVar1 != 0) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                      ,"authentication_do_work",0x242,1,"Failed refreshing SAS token \'%s\'",
                      _cred_type->device_id);
          }
          if ((_cred_type->is_cbs_put_token_in_progress & 1U) == 0) {
            _cred_type->is_sas_token_refresh_in_progress = false;
            update_state(_cred_type,AUTHENTICATION_STATE_ERROR);
            notify_error(_cred_type,AUTHENTICATION_ERROR_SAS_REFRESH_FAILED);
          }
        }
      }
      else if (authentication_handle->state == AUTHENTICATION_STATE_STARTING) {
        iVar1 = create_and_put_SAS_token_to_cbs(authentication_handle);
        if ((iVar1 != 0) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"authentication_do_work",0x254,1,
                    "Failed authenticating device \'%s\' using device keys",_cred_type->device_id);
        }
        if ((_cred_type->is_cbs_put_token_in_progress & 1U) == 0) {
          update_state(_cred_type,AUTHENTICATION_STATE_ERROR);
          notify_error(_cred_type,AUTHENTICATION_ERROR_AUTH_FAILED);
        }
      }
    }
    else {
      iVar1 = verify_cbs_put_token_timeout(authentication_handle,&is_timed_out_1);
      if ((iVar1 == 0) && ((is_timed_out_1 & 1U) != 0)) {
        _cred_type->is_cbs_put_token_in_progress = false;
        update_state(_cred_type,AUTHENTICATION_STATE_ERROR);
        if ((_cred_type->is_sas_token_refresh_in_progress & 1U) == 0) {
          notify_error(_cred_type,AUTHENTICATION_ERROR_AUTH_TIMEOUT);
        }
        else {
          notify_error(_cred_type,AUTHENTICATION_ERROR_SAS_REFRESH_TIMEOUT);
        }
        _cred_type->is_sas_token_refresh_in_progress = false;
      }
    }
  }
  return;
}

Assistant:

void authentication_do_work(AUTHENTICATION_HANDLE authentication_handle)
{
    if (authentication_handle == NULL)
    {
        LogError("authentication_do_work failed (authentication_handle is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

        if (instance->is_cbs_put_token_in_progress)
        {

            bool is_timed_out;
            if (verify_cbs_put_token_timeout(instance, &is_timed_out) == RESULT_OK && is_timed_out)
            {
                instance->is_cbs_put_token_in_progress = false;

                update_state(instance, AUTHENTICATION_STATE_ERROR);

                if (instance->is_sas_token_refresh_in_progress)
                {
                    notify_error(instance, AUTHENTICATION_ERROR_SAS_REFRESH_TIMEOUT);
                }
                else
                {
                    notify_error(instance, AUTHENTICATION_ERROR_AUTH_TIMEOUT);
                }

                instance->is_sas_token_refresh_in_progress = false;
            }
        }
        else if (instance->state == AUTHENTICATION_STATE_STARTED)
        {
            IOTHUB_CREDENTIAL_TYPE cred_type = IoTHubClient_Auth_Get_Credential_Type(instance->authorization_module);
            if (cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY || cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)
            {
                bool is_timed_out;
                if (verify_sas_token_refresh_timeout(instance, &is_timed_out) == RESULT_OK && is_timed_out)
                {
                    instance->is_sas_token_refresh_in_progress = true;

                    if (create_and_put_SAS_token_to_cbs(instance) != RESULT_OK)
                    {
                        LogError("Failed refreshing SAS token '%s'", instance->device_id);
                    }

                    if (!instance->is_cbs_put_token_in_progress)
                    {
                        instance->is_sas_token_refresh_in_progress = false;

                        update_state(instance, AUTHENTICATION_STATE_ERROR);

                        notify_error(instance, AUTHENTICATION_ERROR_SAS_REFRESH_FAILED);
                    }
                }
            }
        }
        else if (instance->state == AUTHENTICATION_STATE_STARTING)
        {
            if (create_and_put_SAS_token_to_cbs(instance) != RESULT_OK)
            {
                LogError("Failed authenticating device '%s' using device keys", instance->device_id);
            }

            if (!instance->is_cbs_put_token_in_progress)
            {
                update_state(instance, AUTHENTICATION_STATE_ERROR);

                notify_error(instance, AUTHENTICATION_ERROR_AUTH_FAILED);
            }
        }
        else
        {
            // Nothing to be done.
        }
    }
}